

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

void __thiscall
HullLibrary::BringOutYourDead
          (HullLibrary *this,btVector3 *verts,uint vcount,btVector3 *overts,uint *ocount,
          uint *indices,uint indexcount)

{
  btScalar bVar1;
  uint n;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint *puVar5;
  btScalar *pbVar6;
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint *in_R8;
  long in_R9;
  int in_stack_00000008;
  int k;
  uint v;
  TUIntArray usedIndices;
  int i;
  btAlignedObjectArray<int> tmpIndices;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  uint uVar7;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  int newsize;
  btAlignedObjectArray<unsigned_int> *in_stack_fffffffffffffed0;
  int local_94;
  btAlignedObjectArray<unsigned_int> local_88;
  int local_64;
  undefined4 local_60;
  btAlignedObjectArray<int> local_50;
  long local_30;
  uint *local_28;
  long local_20;
  uint local_14;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  btAlignedObjectArray<int>::btAlignedObjectArray
            ((btAlignedObjectArray<int> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  btAlignedObjectArray<int>::size((btAlignedObjectArray<int> *)(in_RDI + 0x20));
  local_60 = 0;
  btAlignedObjectArray<int>::resize
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_64 = 0;
  while( true ) {
    iVar3 = local_64;
    iVar2 = btAlignedObjectArray<int>::size((btAlignedObjectArray<int> *)(in_RDI + 0x20));
    newsize = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    if (iVar2 <= iVar3) break;
    piVar4 = btAlignedObjectArray<int>::operator[]
                       ((btAlignedObjectArray<int> *)(in_RDI + 0x20),local_64);
    iVar3 = *piVar4;
    piVar4 = btAlignedObjectArray<int>::operator[](&local_50,local_64);
    *piVar4 = iVar3;
    local_64 = local_64 + 1;
  }
  btAlignedObjectArray<unsigned_int>::btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  btAlignedObjectArray<unsigned_int>::resize
            (in_stack_fffffffffffffed0,newsize,
             (uint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  puVar5 = btAlignedObjectArray<unsigned_int>::operator[](&local_88,0);
  memset(puVar5,0,(ulong)local_14 << 2);
  *local_28 = 0;
  for (local_64 = 0; local_64 < in_stack_00000008; local_64 = local_64 + 1) {
    n = *(uint *)(local_30 + (long)local_64 * 4);
    puVar5 = btAlignedObjectArray<unsigned_int>::operator[](&local_88,n);
    if (*puVar5 == 0) {
      *(uint *)(local_30 + (long)local_64 * 4) = *local_28;
      pbVar6 = btVector3::operator_cast_to_float_((btVector3 *)(local_10 + (ulong)n * 0x10));
      bVar1 = *pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_((btVector3 *)(local_20 + (ulong)*local_28 * 0x10))
      ;
      *pbVar6 = bVar1;
      pbVar6 = btVector3::operator_cast_to_float_((btVector3 *)(local_10 + (ulong)n * 0x10));
      bVar1 = pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_((btVector3 *)(local_20 + (ulong)*local_28 * 0x10))
      ;
      pbVar6[1] = bVar1;
      pbVar6 = btVector3::operator_cast_to_float_((btVector3 *)(local_10 + (ulong)n * 0x10));
      bVar1 = pbVar6[2];
      pbVar6 = btVector3::operator_cast_to_float_((btVector3 *)(local_20 + (ulong)*local_28 * 0x10))
      ;
      pbVar6[2] = bVar1;
      local_94 = 0;
      while( true ) {
        iVar3 = btAlignedObjectArray<int>::size((btAlignedObjectArray<int> *)(in_RDI + 0x20));
        if (iVar3 <= local_94) break;
        puVar5 = (uint *)btAlignedObjectArray<int>::operator[](&local_50,local_94);
        if (*puVar5 == n) {
          uVar7 = *local_28;
          puVar5 = (uint *)btAlignedObjectArray<int>::operator[]
                                     ((btAlignedObjectArray<int> *)(in_RDI + 0x20),local_94);
          *puVar5 = uVar7;
        }
        local_94 = local_94 + 1;
      }
      *local_28 = *local_28 + 1;
      uVar7 = *local_28;
      puVar5 = btAlignedObjectArray<unsigned_int>::operator[](&local_88,n);
      *puVar5 = uVar7;
    }
    else {
      puVar5 = btAlignedObjectArray<unsigned_int>::operator[](&local_88,n);
      *(uint *)(local_30 + (long)local_64 * 4) = *puVar5 - 1;
    }
  }
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_int> *)0x14799a);
  btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x1479a7);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const btVector3* verts,unsigned int vcount, btVector3* overts,unsigned int &ocount,unsigned int *indices,unsigned indexcount)
{
	btAlignedObjectArray<int>tmpIndices;
	tmpIndices.resize(m_vertexIndexMapping.size());
	int i;

	for (i=0;i<m_vertexIndexMapping.size();i++)
	{
		tmpIndices[i] = m_vertexIndexMapping[i];
	}

	TUIntArray usedIndices;
	usedIndices.resize(static_cast<int>(vcount));
	memset(&usedIndices[0],0,sizeof(unsigned int)*vcount);

	ocount = 0;

	for (i=0; i<int (indexcount); i++)
	{
		unsigned int v = indices[i]; // original array index

		btAssert( v >= 0 && v < vcount );

		if ( usedIndices[static_cast<int>(v)] ) // if already remapped
		{
			indices[i] = usedIndices[static_cast<int>(v)]-1; // index to new array
		}
		else
		{

			indices[i] = ocount;      // new index mapping

			overts[ocount][0] = verts[v][0]; // copy old vert to new vert array
			overts[ocount][1] = verts[v][1];
			overts[ocount][2] = verts[v][2];

			for (int k=0;k<m_vertexIndexMapping.size();k++)
			{
				if (tmpIndices[k]==int(v))
					m_vertexIndexMapping[k]=ocount;
			}

			ocount++; // increment output vert count

			btAssert( ocount >=0 && ocount <= vcount );

			usedIndices[static_cast<int>(v)] = ocount; // assign new index remapping

		
		}
	}

	
}